

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall RealCommandRunner::StartCommand(RealCommandRunner *this,Edge *edge)

{
  bool use_console;
  Subprocess *pSVar1;
  string command;
  string local_48;
  pair<Subprocess_*,_Edge_*> local_28;
  
  Edge::EvaluateCommand_abi_cxx11_(&local_48,edge,false);
  use_console = Edge::use_console(edge);
  pSVar1 = SubprocessSet::Add(&this->subprocs_,&local_48,use_console);
  if (pSVar1 != (Subprocess *)0x0) {
    if (this->tokens_ != (TokenPool *)0x0) {
      (*this->tokens_->_vptr_TokenPool[3])();
    }
    local_28.first = pSVar1;
    local_28.second = edge;
    std::
    _Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
    ::_M_emplace_unique<std::pair<Subprocess*,Edge*>>
              ((_Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                *)&this->subproc_to_edge_,&local_28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pSVar1 != (Subprocess *)0x0;
}

Assistant:

bool RealCommandRunner::StartCommand(Edge* edge) {
  string command = edge->EvaluateCommand();
  Subprocess* subproc = subprocs_.Add(command, edge->use_console());
  if (!subproc)
    return false;
  if (tokens_)
    tokens_->Reserve();
  subproc_to_edge_.insert(make_pair(subproc, edge));

  return true;
}